

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O2

void Handlers::Guild_Create(Character *character,PacketReader *reader)

{
  World *pWVar1;
  GuildManager *pGVar2;
  pointer psVar3;
  pointer psVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint num;
  mapped_type *pmVar8;
  PacketBuilder reply;
  shared_ptr<Guild> guild;
  shared_ptr<Guild_Create> create;
  string rank_str;
  undefined1 local_f0 [16];
  string description;
  string tag;
  string local_a0 [32];
  string local_80 [32];
  string local_60;
  string name;
  
  PacketReader::GetInt(reader);
  PacketReader::GetByte(reader);
  PacketReader::GetBreakString_abi_cxx11_(&tag,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_(&name,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_(&description,reader,0xff);
  if (tag._M_string_length < 4) {
    pWVar1 = character->world;
    std::__cxx11::string::string((string *)&reply,"GuildMaxNameLength",(allocator *)&rank_str);
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,(key_type *)&reply);
    iVar6 = util::variant::GetInt(pmVar8);
    if ((ulong)(long)iVar6 < name._M_string_length) {
      std::__cxx11::string::~string((string *)&reply);
    }
    else {
      pGVar2 = character->world->guildmanager;
      std::__cxx11::string::string((string *)&local_60,(string *)&description);
      bVar5 = GuildManager::ValidDescription(pGVar2,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&reply);
      if (((bVar5) && (character->npc_type == Guild)) &&
         ((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0)) {
        iVar6 = Character::HasItem(character,1,false);
        pWVar1 = character->world;
        std::__cxx11::string::string((string *)&reply,"GuildPrice",(allocator *)&rank_str);
        pmVar8 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar1->config,(key_type *)&reply);
        iVar7 = util::variant::GetInt(pmVar8);
        std::__cxx11::string::~string((string *)&reply);
        if (iVar7 <= iVar6) {
          pGVar2 = character->world->guildmanager;
          std::__cxx11::string::string(local_80,(string *)&tag);
          GuildManager::GetCreate((GuildManager *)&create,(string *)pGVar2);
          std::__cxx11::string::~string(local_80);
          if ((create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0) &&
             ((create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->leader
              == character)) {
            psVar3 = ((create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     members).
                     super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            psVar4 = ((create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     members).
                     super__Vector_base<std::shared_ptr<Guild_Member>,_std::allocator<std::shared_ptr<Guild_Member>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pWVar1 = character->world;
            std::__cxx11::string::string
                      ((string *)&reply,"GuildCreateMembers",(allocator *)&rank_str);
            pmVar8 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&pWVar1->config,(key_type *)&reply);
            iVar6 = util::variant::GetInt(pmVar8);
            std::__cxx11::string::~string((string *)&reply);
            if ((ulong)(long)iVar6 <= (ulong)((long)psVar3 - (long)psVar4 >> 4)) {
              pGVar2 = character->world->guildmanager;
              std::__shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2> *)local_f0,
                         &create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>);
              std::__cxx11::string::string(local_a0,(string *)&description);
              GuildManager::CreateGuild
                        ((GuildManager *)&guild,(shared_ptr<Guild_Create> *)pGVar2,
                         (string *)local_f0);
              std::__cxx11::string::~string(local_a0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
              pWVar1 = character->world;
              std::__cxx11::string::string((string *)&reply,"GuildPrice",(allocator *)&rank_str);
              pmVar8 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pWVar1->config,(key_type *)&reply);
              iVar6 = util::variant::GetInt(pmVar8);
              Character::DelItem(character,1,iVar6);
              std::__cxx11::string::~string((string *)&reply);
              Character::GuildRankString_abi_cxx11_(&rank_str,character);
              PacketBuilder::PacketBuilder
                        (&reply,PACKET_GUILD,PACKET_CREATE,
                         rank_str._M_string_length +
                         ((guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                         )._M_string_length + 0xd);
              iVar6 = Character::PlayerID((create.
                                           super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->leader);
              PacketBuilder::AddShort(&reply,(unsigned_short)iVar6);
              PacketBuilder::AddByte(&reply,0xff);
              PacketBuilder::AddBreakString
                        (&reply,&(guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 )->tag,0xff);
              PacketBuilder::AddBreakString
                        (&reply,&(guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 )->name,0xff);
              PacketBuilder::AddBreakString(&reply,&rank_str,0xff);
              num = Character::HasItem(character,1,false);
              PacketBuilder::AddInt(&reply,num);
              Character::Send(character,&reply);
              std::__shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>::reset
                        (&(character->guild_create).
                          super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>);
              PacketBuilder::~PacketBuilder(&reply);
              std::__cxx11::string::~string((string *)&rank_str);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&guild.super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&create.super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&description);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&tag);
  return;
}

Assistant:

void Guild_Create(Character *character, PacketReader &reader)
{
	/*int session = */reader.GetInt();
	reader.GetByte();
	std::string tag = reader.GetBreakString();
	std::string name = reader.GetBreakString();
	std::string description = reader.GetBreakString();

	if (tag.length() > 3
	 || name.length() > std::size_t(int(character->world->config["GuildMaxNameLength"]))
	 || !character->world->guildmanager->ValidDescription(description))
	{
		return;
	}

	if (character->npc_type == ENF::Guild)
	{
		if (!character->guild
		 && character->HasItem(1) >= static_cast<int>(character->world->config["GuildPrice"]))
		{
			std::shared_ptr<class Guild_Create> create = character->world->guildmanager->GetCreate(tag);

			if (create && create->leader == character
			 && create->members.size() >= static_cast<std::size_t>(static_cast<int>(character->world->config["GuildCreateMembers"])))
			{
				std::shared_ptr<Guild> guild = character->world->guildmanager->CreateGuild(create, description);

				character->DelItem(1, character->world->config["GuildPrice"]);

				std::string rank_str = character->GuildRankString();

				PacketBuilder reply(PACKET_GUILD, PACKET_CREATE, 13 + guild->name.length() + rank_str.length());
				reply.AddShort(create->leader->PlayerID());
				reply.AddByte(255);
				reply.AddBreakString(guild->tag);
				reply.AddBreakString(guild->name);
				reply.AddBreakString(rank_str);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);

				character->guild_create.reset();
			}
		}
	}
}